

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined4 uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  undefined4 uVar9;
  size_t sVar10;
  undefined8 uVar11;
  Geometry *pGVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar20;
  int iVar21;
  RTCRayN *pRVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar30;
  long lVar31;
  undefined4 uVar32;
  ulong unaff_R13;
  ulong uVar33;
  size_t sVar34;
  float fVar35;
  float fVar36;
  float fVar57;
  float fVar59;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar58;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar54;
  undefined1 auVar55 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar56;
  float fVar63;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar73;
  float fVar78;
  float fVar79;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar76;
  float fVar80;
  undefined1 auVar77 [16];
  float fVar81;
  float fVar90;
  float fVar91;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar85;
  float fVar92;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar95;
  float fVar102;
  float fVar103;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar100;
  float fVar104;
  undefined1 auVar101 [16];
  float fVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar109;
  float fVar112;
  float fVar113;
  undefined1 auVar110 [16];
  float fVar114;
  float fVar115;
  undefined1 auVar111 [16];
  float fVar116;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar117 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar131 [16];
  float fVar135;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar136 [16];
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 local_12c9;
  ulong local_12c8;
  ulong local_12c0;
  ulong local_12b8;
  ulong local_12b0;
  Scene *local_12a8;
  float fStack_12a0;
  float fStack_129c;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  vbool<4> valid;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 *local_1218;
  ulong local_1210;
  ulong local_1208;
  ulong local_1200;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  float local_1138 [4];
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  undefined1 local_1058 [16];
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined4 local_fd8;
  undefined4 uStack_fd4;
  undefined4 uStack_fd0;
  undefined4 uStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar30 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_1088 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_1098 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_10a8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_10b8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_10c8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_10d8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_10f8 = local_10b8 * 0.99999964;
  fVar105 = local_10c8 * 0.99999964;
  local_10e8 = local_10d8 * 0.99999964;
  local_10b8 = local_10b8 * 1.0000004;
  local_10c8 = local_10c8 * 1.0000004;
  local_10d8 = local_10d8 * 1.0000004;
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1210 = uVar25 ^ 0x10;
  local_1200 = uVar26 ^ 0x10;
  local_1208 = uVar27 ^ 0x10;
  iVar21 = (tray->tnear).field_0.i[k];
  auVar110._4_4_ = iVar21;
  auVar110._0_4_ = iVar21;
  auVar110._8_4_ = iVar21;
  auVar110._12_4_ = iVar21;
  iVar21 = (tray->tfar).field_0.i[k];
  auVar47._4_4_ = iVar21;
  auVar47._0_4_ = iVar21;
  auVar47._8_4_ = iVar21;
  auVar47._12_4_ = iVar21;
  local_1218 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  fStack_1084 = local_1088;
  fStack_1080 = local_1088;
  fStack_107c = local_1088;
  fStack_1094 = local_1098;
  fStack_1090 = local_1098;
  fStack_108c = local_1098;
  fStack_10a4 = local_10a8;
  fStack_10a0 = local_10a8;
  fStack_109c = local_10a8;
  fStack_10b4 = local_10b8;
  fStack_10b0 = local_10b8;
  fStack_10ac = local_10b8;
  fStack_10c4 = local_10c8;
  fStack_10c0 = local_10c8;
  fStack_10bc = local_10c8;
  fStack_10d4 = local_10d8;
  fStack_10d0 = local_10d8;
  fStack_10cc = local_10d8;
  fStack_10e4 = local_10e8;
  fStack_10e0 = local_10e8;
  fStack_10dc = local_10e8;
  fStack_10f4 = local_10f8;
  fStack_10f0 = local_10f8;
  fStack_10ec = local_10f8;
  uVar23 = local_1210;
  fVar62 = local_1098;
  fVar92 = local_1098;
  fVar114 = local_1098;
  fVar115 = local_1098;
  fVar130 = local_10c8;
  fVar35 = local_10c8;
  fVar36 = local_10c8;
  fVar57 = local_10c8;
  fVar58 = local_10d8;
  fVar59 = local_10d8;
  fVar60 = local_10d8;
  fVar61 = local_10d8;
  fVar63 = local_10e8;
  fVar70 = local_10e8;
  fVar71 = local_10e8;
  fVar72 = local_10e8;
  fVar73 = local_10f8;
  fVar78 = local_10f8;
  fVar79 = local_10f8;
  fVar80 = local_10f8;
  fVar81 = local_1088;
  fVar90 = local_1088;
  fVar91 = local_1088;
  fVar95 = local_1088;
  fVar102 = local_10a8;
  fVar103 = local_10a8;
  fVar104 = local_10a8;
  fVar109 = local_10a8;
  fVar112 = local_10b8;
  fVar113 = local_10b8;
  fVar116 = local_10b8;
  fVar118 = local_10b8;
  local_12c8 = uVar27;
  local_12c0 = uVar26;
  local_12b8 = uVar25;
  do {
    do {
      do {
        if (pSVar30 == stack) {
          return;
        }
        pSVar20 = pSVar30 + -1;
        pSVar30 = pSVar30 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar20->dist &&
               (float)pSVar20->dist != *(float *)(ray + k * 4 + 0x80));
      sVar34 = (pSVar30->ptr).ptr;
      do {
        if ((sVar34 & 8) == 0) {
          pfVar1 = (float *)(sVar34 + 0x20 + uVar25);
          auVar37._0_4_ = (*pfVar1 - fVar81) * fVar73;
          auVar37._4_4_ = (pfVar1[1] - fVar90) * fVar78;
          auVar37._8_4_ = (pfVar1[2] - fVar91) * fVar79;
          auVar37._12_4_ = (pfVar1[3] - fVar95) * fVar80;
          pfVar1 = (float *)(sVar34 + 0x20 + uVar26);
          auVar98._0_4_ = (*pfVar1 - fVar62) * fVar105;
          auVar98._4_4_ = (pfVar1[1] - fVar92) * fVar105;
          auVar98._8_4_ = (pfVar1[2] - fVar114) * fVar105;
          auVar98._12_4_ = (pfVar1[3] - fVar115) * fVar105;
          auVar37 = maxps(auVar37,auVar98);
          pfVar1 = (float *)(sVar34 + 0x20 + uVar27);
          auVar99._0_4_ = (*pfVar1 - fVar102) * fVar63;
          auVar99._4_4_ = (pfVar1[1] - fVar103) * fVar70;
          auVar99._8_4_ = (pfVar1[2] - fVar104) * fVar71;
          auVar99._12_4_ = (pfVar1[3] - fVar109) * fVar72;
          auVar74 = maxps(auVar99,auVar110);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar37,auVar74);
          pfVar1 = (float *)(sVar34 + 0x20 + uVar23);
          auVar107._0_4_ = (*pfVar1 - fVar81) * fVar112;
          auVar107._4_4_ = (pfVar1[1] - fVar90) * fVar113;
          auVar107._8_4_ = (pfVar1[2] - fVar91) * fVar116;
          auVar107._12_4_ = (pfVar1[3] - fVar95) * fVar118;
          pfVar1 = (float *)(sVar34 + 0x20 + local_1200);
          auVar82._0_4_ = (*pfVar1 - fVar62) * fVar130;
          auVar82._4_4_ = (pfVar1[1] - fVar92) * fVar35;
          auVar82._8_4_ = (pfVar1[2] - fVar114) * fVar36;
          auVar82._12_4_ = (pfVar1[3] - fVar115) * fVar57;
          auVar37 = minps(auVar107,auVar82);
          pfVar1 = (float *)(sVar34 + 0x20 + local_1208);
          auVar83._0_4_ = (*pfVar1 - fVar102) * fVar58;
          auVar83._4_4_ = (pfVar1[1] - fVar103) * fVar59;
          auVar83._8_4_ = (pfVar1[2] - fVar104) * fVar60;
          auVar83._12_4_ = (pfVar1[3] - fVar109) * fVar61;
          auVar74 = minps(auVar83,auVar47);
          auVar37 = minps(auVar37,auVar74);
          auVar74._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar37._4_4_);
          auVar74._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar37._0_4_);
          auVar74._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar37._8_4_);
          auVar74._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar37._12_4_);
          uVar32 = movmskps((int)unaff_R13,auVar74);
          unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),uVar32);
        }
        if ((sVar34 & 8) == 0) {
          if (unaff_R13 == 0) {
            iVar21 = 4;
          }
          else {
            uVar33 = sVar34 & 0xfffffffffffffff0;
            lVar29 = 0;
            if (unaff_R13 != 0) {
              for (; (unaff_R13 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
              }
            }
            iVar21 = 0;
            sVar34 = *(size_t *)(uVar33 + lVar29 * 8);
            uVar28 = unaff_R13 - 1 & unaff_R13;
            if (uVar28 != 0) {
              uVar8 = tNear.field_0.i[lVar29];
              lVar29 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                }
              }
              sVar10 = *(size_t *)(uVar33 + lVar29 * 8);
              uVar6 = tNear.field_0.i[lVar29];
              uVar28 = uVar28 - 1 & uVar28;
              uVar25 = local_12b8;
              uVar26 = local_12c0;
              uVar27 = local_12c8;
              if (uVar28 == 0) {
                if (uVar8 < uVar6) {
                  (pSVar30->ptr).ptr = sVar10;
                  pSVar30->dist = uVar6;
                  pSVar30 = pSVar30 + 1;
                }
                else {
                  (pSVar30->ptr).ptr = sVar34;
                  pSVar30->dist = uVar8;
                  pSVar30 = pSVar30 + 1;
                  sVar34 = sVar10;
                }
              }
              else {
                auVar75._8_4_ = uVar8;
                auVar75._0_8_ = sVar34;
                auVar75._12_4_ = 0;
                auVar96._8_4_ = uVar6;
                auVar96._0_8_ = sVar10;
                auVar96._12_4_ = 0;
                lVar29 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                  }
                }
                uVar11 = *(undefined8 *)(uVar33 + lVar29 * 8);
                iVar7 = tNear.field_0.i[lVar29];
                auVar84._8_4_ = iVar7;
                auVar84._0_8_ = uVar11;
                auVar84._12_4_ = 0;
                auVar38._8_4_ = -(uint)((int)uVar8 < (int)uVar6);
                uVar28 = uVar28 - 1 & uVar28;
                if (uVar28 == 0) {
                  auVar38._4_4_ = auVar38._8_4_;
                  auVar38._0_4_ = auVar38._8_4_;
                  auVar38._12_4_ = auVar38._8_4_;
                  auVar93._8_4_ = uVar6;
                  auVar93._0_8_ = sVar10;
                  auVar93._12_4_ = 0;
                  auVar74 = blendvps(auVar93,auVar75,auVar38);
                  auVar37 = blendvps(auVar75,auVar96,auVar38);
                  auVar39._8_4_ = -(uint)(auVar74._8_4_ < iVar7);
                  auVar39._4_4_ = auVar39._8_4_;
                  auVar39._0_4_ = auVar39._8_4_;
                  auVar39._12_4_ = auVar39._8_4_;
                  auVar97._8_4_ = iVar7;
                  auVar97._0_8_ = uVar11;
                  auVar97._12_4_ = 0;
                  auVar98 = blendvps(auVar97,auVar74,auVar39);
                  auVar74 = blendvps(auVar74,auVar84,auVar39);
                  auVar40._8_4_ = -(uint)(auVar37._8_4_ < auVar74._8_4_);
                  auVar40._4_4_ = auVar40._8_4_;
                  auVar40._0_4_ = auVar40._8_4_;
                  auVar40._12_4_ = auVar40._8_4_;
                  SVar85 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar74,auVar37,auVar40);
                  SVar76 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar37,auVar74,auVar40);
                  *pSVar30 = SVar76;
                  pSVar30[1] = SVar85;
                  sVar34 = auVar98._0_8_;
                  pSVar30 = pSVar30 + 2;
                }
                else {
                  lVar29 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                    }
                  }
                  auVar41._4_4_ = auVar38._8_4_;
                  auVar41._0_4_ = auVar38._8_4_;
                  auVar41._8_4_ = auVar38._8_4_;
                  auVar41._12_4_ = auVar38._8_4_;
                  auVar98 = blendvps(auVar96,auVar75,auVar41);
                  auVar37 = blendvps(auVar75,auVar96,auVar41);
                  auVar106._8_4_ = tNear.field_0.i[lVar29];
                  auVar106._0_8_ = *(undefined8 *)(uVar33 + lVar29 * 8);
                  auVar106._12_4_ = 0;
                  auVar42._8_4_ = -(uint)(iVar7 < tNear.field_0.i[lVar29]);
                  auVar42._4_4_ = auVar42._8_4_;
                  auVar42._0_4_ = auVar42._8_4_;
                  auVar42._12_4_ = auVar42._8_4_;
                  auVar99 = blendvps(auVar106,auVar84,auVar42);
                  auVar74 = blendvps(auVar84,auVar106,auVar42);
                  auVar43._8_4_ = -(uint)(auVar37._8_4_ < auVar74._8_4_);
                  auVar43._4_4_ = auVar43._8_4_;
                  auVar43._0_4_ = auVar43._8_4_;
                  auVar43._12_4_ = auVar43._8_4_;
                  auVar107 = blendvps(auVar74,auVar37,auVar43);
                  SVar76 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar37,auVar74,auVar43);
                  auVar44._8_4_ = -(uint)(auVar98._8_4_ < auVar99._8_4_);
                  auVar44._4_4_ = auVar44._8_4_;
                  auVar44._0_4_ = auVar44._8_4_;
                  auVar44._12_4_ = auVar44._8_4_;
                  auVar37 = blendvps(auVar99,auVar98,auVar44);
                  auVar74 = blendvps(auVar98,auVar99,auVar44);
                  auVar45._8_4_ = -(uint)(auVar74._8_4_ < auVar107._8_4_);
                  auVar45._4_4_ = auVar45._8_4_;
                  auVar45._0_4_ = auVar45._8_4_;
                  auVar45._12_4_ = auVar45._8_4_;
                  SVar100 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar107,auVar74,auVar45);
                  SVar85 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar74,auVar107,auVar45);
                  *pSVar30 = SVar76;
                  pSVar30[1] = SVar85;
                  pSVar30[2] = SVar100;
                  sVar34 = auVar37._0_8_;
                  pSVar30 = pSVar30 + 3;
                }
              }
            }
          }
        }
        else {
          iVar21 = 6;
        }
      } while (iVar21 == 0);
    } while (iVar21 != 6);
    uVar23 = (ulong)((uint)sVar34 & 0xf);
    if (uVar23 != 8) {
      uVar33 = sVar34 & 0xfffffffffffffff0;
      lVar29 = 0;
      local_12b0 = unaff_R13;
      do {
        lVar31 = lVar29 * 0xb0;
        fVar62 = *(float *)(ray + k * 4);
        fVar92 = *(float *)(ray + k * 4 + 0x10);
        fVar114 = *(float *)(ray + k * 4 + 0x20);
        pfVar1 = (float *)(uVar33 + lVar31);
        pfVar2 = (float *)(uVar33 + 0x10 + lVar31);
        pfVar3 = (float *)(uVar33 + 0x20 + lVar31);
        pfVar4 = (float *)(uVar33 + 0x30 + lVar31);
        local_1018 = *pfVar1 - fVar62;
        fStack_1014 = pfVar1[1] - fVar62;
        fStack_1010 = pfVar1[2] - fVar62;
        fStack_100c = pfVar1[3] - fVar62;
        local_1028 = *pfVar2 - fVar92;
        fStack_1024 = pfVar2[1] - fVar92;
        fStack_1020 = pfVar2[2] - fVar92;
        fStack_101c = pfVar2[3] - fVar92;
        local_1038 = *pfVar3 - fVar114;
        fStack_1034 = pfVar3[1] - fVar114;
        fStack_1030 = pfVar3[2] - fVar114;
        fStack_102c = pfVar3[3] - fVar114;
        fVar35 = *pfVar4 - fVar62;
        fVar57 = pfVar4[1] - fVar62;
        fVar59 = pfVar4[2] - fVar62;
        fVar61 = pfVar4[3] - fVar62;
        pfVar1 = (float *)(uVar33 + 0x40 + lVar31);
        fVar73 = *pfVar1 - fVar92;
        fVar78 = pfVar1[1] - fVar92;
        fVar79 = pfVar1[2] - fVar92;
        fVar80 = pfVar1[3] - fVar92;
        pfVar1 = (float *)(uVar33 + 0x50 + lVar31);
        fVar95 = *pfVar1 - fVar114;
        fVar102 = pfVar1[1] - fVar114;
        fVar103 = pfVar1[2] - fVar114;
        fVar104 = pfVar1[3] - fVar114;
        pfVar1 = (float *)(uVar33 + 0x60 + lVar31);
        fVar36 = *pfVar1 - fVar62;
        fVar58 = pfVar1[1] - fVar62;
        fVar60 = pfVar1[2] - fVar62;
        fVar62 = pfVar1[3] - fVar62;
        pfVar1 = (float *)(uVar33 + 0x70 + lVar31);
        fVar81 = *pfVar1 - fVar92;
        fVar90 = pfVar1[1] - fVar92;
        fVar91 = pfVar1[2] - fVar92;
        fVar92 = pfVar1[3] - fVar92;
        pfVar1 = (float *)(uVar33 + 0x80 + lVar31);
        fVar109 = *pfVar1 - fVar114;
        fVar112 = pfVar1[1] - fVar114;
        fVar113 = pfVar1[2] - fVar114;
        fVar114 = pfVar1[3] - fVar114;
        fVar121 = fVar36 - local_1018;
        fVar123 = fVar58 - fStack_1014;
        fVar125 = fVar60 - fStack_1010;
        fVar127 = fVar62 - fStack_100c;
        fVar140 = fVar81 - local_1028;
        fVar141 = fVar90 - fStack_1024;
        fVar142 = fVar91 - fStack_1020;
        fVar143 = fVar92 - fStack_101c;
        local_1048 = fVar109 - local_1038;
        fStack_1044 = fVar112 - fStack_1034;
        fStack_1040 = fVar113 - fStack_1030;
        fStack_103c = fVar114 - fStack_102c;
        fStack_12a0 = *(float *)(ray + k * 4 + 0x50);
        fVar115 = *(float *)(ray + k * 4 + 0x60);
        fVar130 = *(float *)(ray + k * 4 + 0x40);
        local_1078 = (fVar140 * (local_1038 + fVar109) - (local_1028 + fVar81) * local_1048) *
                     fVar130 + ((local_1018 + fVar36) * local_1048 -
                               (local_1038 + fVar109) * fVar121) * fStack_12a0 +
                               (fVar121 * (local_1028 + fVar81) - (local_1018 + fVar36) * fVar140) *
                               fVar115;
        fStack_1074 = (fVar141 * (fStack_1034 + fVar112) - (fStack_1024 + fVar90) * fStack_1044) *
                      fVar130 + ((fStack_1014 + fVar58) * fStack_1044 -
                                (fStack_1034 + fVar112) * fVar123) * fStack_12a0 +
                                (fVar123 * (fStack_1024 + fVar90) - (fStack_1014 + fVar58) * fVar141
                                ) * fVar115;
        fStack_1070 = (fVar142 * (fStack_1030 + fVar113) - (fStack_1020 + fVar91) * fStack_1040) *
                      fVar130 + ((fStack_1010 + fVar60) * fStack_1040 -
                                (fStack_1030 + fVar113) * fVar125) * fStack_12a0 +
                                (fVar125 * (fStack_1020 + fVar91) - (fStack_1010 + fVar60) * fVar142
                                ) * fVar115;
        fStack_106c = (fVar143 * (fStack_102c + fVar114) - (fStack_101c + fVar92) * fStack_103c) *
                      fVar130 + ((fStack_100c + fVar62) * fStack_103c -
                                (fStack_102c + fVar114) * fVar127) * fStack_12a0 +
                                (fVar127 * (fStack_101c + fVar92) - (fStack_100c + fVar62) * fVar143
                                ) * fVar115;
        fVar63 = local_1018 - fVar35;
        fVar70 = fStack_1014 - fVar57;
        fVar71 = fStack_1010 - fVar59;
        fVar72 = fStack_100c - fVar61;
        fVar116 = local_1028 - fVar73;
        fVar118 = fStack_1024 - fVar78;
        fVar119 = fStack_1020 - fVar79;
        fVar120 = fStack_101c - fVar80;
        fVar135 = local_1038 - fVar95;
        fVar137 = fStack_1034 - fVar102;
        fVar138 = fStack_1030 - fVar103;
        fVar139 = fStack_102c - fVar104;
        local_1058._0_4_ =
             (fVar116 * (local_1038 + fVar95) - (local_1028 + fVar73) * fVar135) * fVar130 +
             ((local_1018 + fVar35) * fVar135 - (local_1038 + fVar95) * fVar63) * fStack_12a0 +
             (fVar63 * (local_1028 + fVar73) - (local_1018 + fVar35) * fVar116) * fVar115;
        local_1058._4_4_ =
             (fVar118 * (fStack_1034 + fVar102) - (fStack_1024 + fVar78) * fVar137) * fVar130 +
             ((fStack_1014 + fVar57) * fVar137 - (fStack_1034 + fVar102) * fVar70) * fStack_12a0 +
             (fVar70 * (fStack_1024 + fVar78) - (fStack_1014 + fVar57) * fVar118) * fVar115;
        local_1058._8_4_ =
             (fVar119 * (fStack_1030 + fVar103) - (fStack_1020 + fVar79) * fVar138) * fVar130 +
             ((fStack_1010 + fVar59) * fVar138 - (fStack_1030 + fVar103) * fVar71) * fStack_12a0 +
             (fVar71 * (fStack_1020 + fVar79) - (fStack_1010 + fVar59) * fVar119) * fVar115;
        local_1058._12_4_ =
             (fVar120 * (fStack_102c + fVar104) - (fStack_101c + fVar80) * fVar139) * fVar130 +
             ((fStack_100c + fVar61) * fVar139 - (fStack_102c + fVar104) * fVar72) * fStack_12a0 +
             (fVar72 * (fStack_101c + fVar80) - (fStack_100c + fVar61) * fVar120) * fVar115;
        fVar122 = fVar35 - fVar36;
        fVar124 = fVar57 - fVar58;
        fVar126 = fVar59 - fVar60;
        fVar128 = fVar61 - fVar62;
        fVar144 = fVar73 - fVar81;
        fVar145 = fVar78 - fVar90;
        fVar146 = fVar79 - fVar91;
        fVar147 = fVar80 - fVar92;
        fVar129 = fVar95 - fVar109;
        fVar132 = fVar102 - fVar112;
        fVar133 = fVar103 - fVar113;
        fVar134 = fVar104 - fVar114;
        auVar77._0_4_ =
             (fVar144 * (fVar109 + fVar95) - (fVar81 + fVar73) * fVar129) * fVar130 +
             ((fVar36 + fVar35) * fVar129 - (fVar109 + fVar95) * fVar122) * fStack_12a0 +
             (fVar122 * (fVar81 + fVar73) - (fVar36 + fVar35) * fVar144) * fVar115;
        auVar77._4_4_ =
             (fVar145 * (fVar112 + fVar102) - (fVar90 + fVar78) * fVar132) * fVar130 +
             ((fVar58 + fVar57) * fVar132 - (fVar112 + fVar102) * fVar124) * fStack_12a0 +
             (fVar124 * (fVar90 + fVar78) - (fVar58 + fVar57) * fVar145) * fVar115;
        auVar77._8_4_ =
             (fVar146 * (fVar113 + fVar103) - (fVar91 + fVar79) * fVar133) * fVar130 +
             ((fVar60 + fVar59) * fVar133 - (fVar113 + fVar103) * fVar126) * fStack_12a0 +
             (fVar126 * (fVar91 + fVar79) - (fVar60 + fVar59) * fVar146) * fVar115;
        auVar77._12_4_ =
             (fVar147 * (fVar114 + fVar104) - (fVar92 + fVar80) * fVar134) * fVar130 +
             ((fVar62 + fVar61) * fVar134 - (fVar114 + fVar104) * fVar128) * fStack_12a0 +
             (fVar128 * (fVar92 + fVar80) - (fVar62 + fVar61) * fVar147) * fVar115;
        local_1068 = local_1058._0_4_ + local_1078 + auVar77._0_4_;
        fStack_1064 = local_1058._4_4_ + fStack_1074 + auVar77._4_4_;
        fStack_1060 = local_1058._8_4_ + fStack_1070 + auVar77._8_4_;
        fStack_105c = local_1058._12_4_ + fStack_106c + auVar77._12_4_;
        auVar46._4_4_ = fStack_1074;
        auVar46._0_4_ = local_1078;
        auVar46._8_4_ = fStack_1070;
        auVar46._12_4_ = fStack_106c;
        auVar47 = minps(auVar46,local_1058);
        auVar47 = minps(auVar47,auVar77);
        auVar86._4_4_ = fStack_1074;
        auVar86._0_4_ = local_1078;
        auVar86._8_4_ = fStack_1070;
        auVar86._12_4_ = fStack_106c;
        auVar37 = maxps(auVar86,local_1058);
        auVar37 = maxps(auVar37,auVar77);
        fVar62 = ABS(local_1068) * 1.1920929e-07;
        fVar92 = ABS(fStack_1064) * 1.1920929e-07;
        fVar114 = ABS(fStack_1060) * 1.1920929e-07;
        fVar35 = ABS(fStack_105c) * 1.1920929e-07;
        auVar87._4_4_ = -(uint)(auVar37._4_4_ <= fVar92);
        auVar87._0_4_ = -(uint)(auVar37._0_4_ <= fVar62);
        auVar87._8_4_ = -(uint)(auVar37._8_4_ <= fVar114);
        auVar87._12_4_ = -(uint)(auVar37._12_4_ <= fVar35);
        auVar48._4_4_ = -(uint)(-fVar92 <= auVar47._4_4_);
        auVar48._0_4_ = -(uint)(-fVar62 <= auVar47._0_4_);
        auVar48._8_4_ = -(uint)(-fVar114 <= auVar47._8_4_);
        auVar48._12_4_ = -(uint)(-fVar35 <= auVar47._12_4_);
        auVar87 = auVar87 | auVar48;
        iVar21 = movmskps((int)&local_12c9,auVar87);
        if (iVar21 != 0) {
          auVar101._0_4_ = fVar140 * fVar135 - fVar116 * local_1048;
          auVar101._4_4_ = fVar141 * fVar137 - fVar118 * fStack_1044;
          auVar101._8_4_ = fVar142 * fVar138 - fVar119 * fStack_1040;
          auVar101._12_4_ = fVar143 * fVar139 - fVar120 * fStack_103c;
          auVar117._0_4_ = fVar116 * fVar129 - fVar135 * fVar144;
          auVar117._4_4_ = fVar118 * fVar132 - fVar137 * fVar145;
          auVar117._8_4_ = fVar119 * fVar133 - fVar138 * fVar146;
          auVar117._12_4_ = fVar120 * fVar134 - fVar139 * fVar147;
          auVar49._4_4_ = -(uint)(ABS(fVar118 * fStack_1044) < ABS(fVar137 * fVar145));
          auVar49._0_4_ = -(uint)(ABS(fVar116 * local_1048) < ABS(fVar135 * fVar144));
          auVar49._8_4_ = -(uint)(ABS(fVar119 * fStack_1040) < ABS(fVar138 * fVar146));
          auVar49._12_4_ = -(uint)(ABS(fVar120 * fStack_103c) < ABS(fVar139 * fVar147));
          local_1128 = blendvps(auVar117,auVar101,auVar49);
          auVar136._0_4_ = fVar135 * fVar122 - fVar63 * fVar129;
          auVar136._4_4_ = fVar137 * fVar124 - fVar70 * fVar132;
          auVar136._8_4_ = fVar138 * fVar126 - fVar71 * fVar133;
          auVar136._12_4_ = fVar139 * fVar128 - fVar72 * fVar134;
          auVar50._4_4_ = -(uint)(ABS(fVar137 * fVar123) < ABS(fVar70 * fVar132));
          auVar50._0_4_ = -(uint)(ABS(fVar135 * fVar121) < ABS(fVar63 * fVar129));
          auVar50._8_4_ = -(uint)(ABS(fVar138 * fVar125) < ABS(fVar71 * fVar133));
          auVar50._12_4_ = -(uint)(ABS(fVar139 * fVar127) < ABS(fVar72 * fVar134));
          auVar16._4_4_ = fStack_1044 * fVar70 - fVar137 * fVar123;
          auVar16._0_4_ = local_1048 * fVar63 - fVar135 * fVar121;
          auVar16._8_4_ = fStack_1040 * fVar71 - fVar138 * fVar125;
          auVar16._12_4_ = fStack_103c * fVar72 - fVar139 * fVar127;
          local_1118 = blendvps(auVar136,auVar16,auVar50);
          auVar94._0_4_ = fVar121 * fVar116 - fVar63 * fVar140;
          auVar94._4_4_ = fVar123 * fVar118 - fVar70 * fVar141;
          auVar94._8_4_ = fVar125 * fVar119 - fVar71 * fVar142;
          auVar94._12_4_ = fVar127 * fVar120 - fVar72 * fVar143;
          auVar108._0_4_ = fVar63 * fVar144 - fVar116 * fVar122;
          auVar108._4_4_ = fVar70 * fVar145 - fVar118 * fVar124;
          auVar108._8_4_ = fVar71 * fVar146 - fVar119 * fVar126;
          auVar108._12_4_ = fVar72 * fVar147 - fVar120 * fVar128;
          auVar51._4_4_ = -(uint)(ABS(fVar70 * fVar141) < ABS(fVar118 * fVar124));
          auVar51._0_4_ = -(uint)(ABS(fVar63 * fVar140) < ABS(fVar116 * fVar122));
          auVar51._8_4_ = -(uint)(ABS(fVar71 * fVar142) < ABS(fVar119 * fVar126));
          auVar51._12_4_ = -(uint)(ABS(fVar72 * fVar143) < ABS(fVar120 * fVar128));
          local_1108 = blendvps(auVar108,auVar94,auVar51);
          fVar58 = fVar130 * local_1128._0_4_ +
                   fStack_12a0 * local_1118._0_4_ + fVar115 * local_1108._0_4_;
          fVar59 = fVar130 * local_1128._4_4_ +
                   fStack_12a0 * local_1118._4_4_ + fVar115 * local_1108._4_4_;
          fVar60 = fVar130 * local_1128._8_4_ +
                   fStack_12a0 * local_1118._8_4_ + fVar115 * local_1108._8_4_;
          fVar61 = fVar130 * local_1128._12_4_ +
                   fStack_12a0 * local_1118._12_4_ + fVar115 * local_1108._12_4_;
          fVar58 = fVar58 + fVar58;
          fVar59 = fVar59 + fVar59;
          fVar60 = fVar60 + fVar60;
          fVar61 = fVar61 + fVar61;
          auVar52._0_4_ = local_1028 * local_1118._0_4_ + local_1038 * local_1108._0_4_;
          auVar52._4_4_ = fStack_1024 * local_1118._4_4_ + fStack_1034 * local_1108._4_4_;
          auVar52._8_4_ = fStack_1020 * local_1118._8_4_ + fStack_1030 * local_1108._8_4_;
          auVar52._12_4_ = fStack_101c * local_1118._12_4_ + fStack_102c * local_1108._12_4_;
          fVar130 = local_1018 * local_1128._0_4_ + auVar52._0_4_;
          fVar35 = fStack_1014 * local_1128._4_4_ + auVar52._4_4_;
          fVar36 = fStack_1010 * local_1128._8_4_ + auVar52._8_4_;
          fVar57 = fStack_100c * local_1128._12_4_ + auVar52._12_4_;
          auVar15._4_4_ = fVar59;
          auVar15._0_4_ = fVar58;
          auVar15._8_4_ = fVar60;
          auVar15._12_4_ = fVar61;
          auVar47 = rcpps(auVar52,auVar15);
          fVar62 = auVar47._0_4_;
          fVar92 = auVar47._4_4_;
          fVar114 = auVar47._8_4_;
          fVar115 = auVar47._12_4_;
          local_1298 = ((1.0 - fVar58 * fVar62) * fVar62 + fVar62) * (fVar130 + fVar130);
          fStack_1294 = ((1.0 - fVar59 * fVar92) * fVar92 + fVar92) * (fVar35 + fVar35);
          fStack_1290 = ((1.0 - fVar60 * fVar114) * fVar114 + fVar114) * (fVar36 + fVar36);
          fStack_128c = ((1.0 - fVar61 * fVar115) * fVar115 + fVar115) * (fVar57 + fVar57);
          fVar62 = *(float *)(ray + k * 4 + 0x80);
          fVar92 = *(float *)(ray + k * 4 + 0x30);
          auVar64._4_4_ = -(uint)(fVar92 <= fStack_1294);
          auVar64._0_4_ = -(uint)(fVar92 <= local_1298);
          auVar64._8_4_ = -(uint)(fVar92 <= fStack_1290);
          auVar64._12_4_ = -(uint)(fVar92 <= fStack_128c);
          auVar53._0_4_ = -(uint)(local_1298 <= fVar62 && fVar92 <= local_1298) & auVar87._0_4_;
          auVar53._4_4_ = -(uint)(fStack_1294 <= fVar62 && fVar92 <= fStack_1294) & auVar87._4_4_;
          auVar53._8_4_ = -(uint)(fStack_1290 <= fVar62 && fVar92 <= fStack_1290) & auVar87._8_4_;
          auVar53._12_4_ = -(uint)(fStack_128c <= fVar62 && fVar92 <= fStack_128c) & auVar87._12_4_;
          iVar21 = movmskps(iVar21,auVar53);
          if (iVar21 != 0) {
            valid.field_0.i[0] = auVar53._0_4_ & -(uint)(fVar58 != 0.0);
            valid.field_0.i[1] = auVar53._4_4_ & -(uint)(fVar59 != 0.0);
            valid.field_0.i[2] = auVar53._8_4_ & -(uint)(fVar60 != 0.0);
            valid.field_0.i[3] = auVar53._12_4_ & -(uint)(fVar61 != 0.0);
            iVar21 = movmskps(iVar21,(undefined1  [16])valid.field_0);
            if (iVar21 != 0) {
              tNear.field_0.v[1] = fStack_1074;
              tNear.field_0.v[0] = local_1078;
              tNear.field_0.v[2] = fStack_1070;
              tNear.field_0.v[3] = fStack_106c;
              auVar19._4_4_ = fStack_1064;
              auVar19._0_4_ = local_1068;
              auVar19._8_4_ = fStack_1060;
              auVar19._12_4_ = fStack_105c;
              local_1138[0] = local_1298;
              local_1138[1] = fStack_1294;
              local_1138[2] = fStack_1290;
              local_1138[3] = fStack_128c;
              local_12a8 = context->scene;
              auVar47 = rcpps(auVar64,auVar19);
              fVar62 = auVar47._0_4_;
              fVar92 = auVar47._4_4_;
              fVar114 = auVar47._8_4_;
              fVar115 = auVar47._12_4_;
              fVar62 = (float)(-(uint)(1e-18 <= ABS(local_1068)) &
                              (uint)(((float)DAT_01feca10 - local_1068 * fVar62) * fVar62 + fVar62))
              ;
              fVar92 = (float)(-(uint)(1e-18 <= ABS(fStack_1064)) &
                              (uint)((DAT_01feca10._4_4_ - fStack_1064 * fVar92) * fVar92 + fVar92))
              ;
              fVar114 = (float)(-(uint)(1e-18 <= ABS(fStack_1060)) &
                               (uint)((DAT_01feca10._8_4_ - fStack_1060 * fVar114) * fVar114 +
                                     fVar114));
              fVar115 = (float)(-(uint)(1e-18 <= ABS(fStack_105c)) &
                               (uint)((DAT_01feca10._12_4_ - fStack_105c * fVar115) * fVar115 +
                                     fVar115));
              auVar131._0_4_ = local_1078 * fVar62;
              auVar131._4_4_ = fStack_1074 * fVar92;
              auVar131._8_4_ = fStack_1070 * fVar114;
              auVar131._12_4_ = fStack_106c * fVar115;
              local_1158 = minps(auVar131,_DAT_01feca10);
              auVar111._0_4_ = fVar62 * local_1058._0_4_;
              auVar111._4_4_ = fVar92 * local_1058._4_4_;
              auVar111._8_4_ = fVar114 * local_1058._8_4_;
              auVar111._12_4_ = fVar115 * local_1058._12_4_;
              local_1148 = minps(auVar111,_DAT_01feca10);
              auVar13._4_4_ = fStack_1294;
              auVar13._0_4_ = local_1298;
              auVar13._8_4_ = fStack_1290;
              auVar13._12_4_ = fStack_128c;
              auVar37 = blendvps(_DAT_01feb9f0,auVar13,(undefined1  [16])valid.field_0);
              auVar88._4_4_ = auVar37._0_4_;
              auVar88._0_4_ = auVar37._4_4_;
              auVar88._8_4_ = auVar37._12_4_;
              auVar88._12_4_ = auVar37._8_4_;
              auVar47 = minps(auVar88,auVar37);
              auVar65._0_8_ = auVar47._8_8_;
              auVar65._8_4_ = auVar47._0_4_;
              auVar65._12_4_ = auVar47._4_4_;
              auVar47 = minps(auVar65,auVar47);
              auVar66._0_8_ =
                   CONCAT44(-(uint)(auVar47._4_4_ == auVar37._4_4_) & valid.field_0.i[1],
                            -(uint)(auVar47._0_4_ == auVar37._0_4_) & valid.field_0.i[0]);
              auVar66._8_4_ = -(uint)(auVar47._8_4_ == auVar37._8_4_) & valid.field_0.i[2];
              auVar66._12_4_ = -(uint)(auVar47._12_4_ == auVar37._12_4_) & valid.field_0.i[3];
              iVar21 = movmskps((int)&local_12c9,auVar66);
              aVar54 = valid.field_0;
              if (iVar21 != 0) {
                aVar54.i[2] = auVar66._8_4_;
                aVar54._0_8_ = auVar66._0_8_;
                aVar54.i[3] = auVar66._12_4_;
              }
              lVar31 = lVar31 + uVar33;
              uVar32 = movmskps(iVar21,(undefined1  [16])aVar54);
              uVar28 = CONCAT44((int)((ulong)&local_12c9 >> 0x20),uVar32);
              lVar24 = 0;
              fStack_129c = fStack_12a0;
              if (uVar28 != 0) {
                for (; (uVar28 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                }
              }
LAB_0026ca11:
              uVar8 = *(uint *)(lVar31 + 0x90 + lVar24 * 4);
              pRVar22 = (RTCRayN *)(ulong)uVar8;
              pGVar12 = (local_12a8->geometries).items[(long)pRVar22].ptr;
              if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[lVar24] = 0.0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar32 = *(undefined4 *)(local_1158 + lVar24 * 4);
                  fVar62 = local_1138[lVar24 + -4];
                  *(float *)(ray + k * 4 + 0x80) = local_1138[lVar24];
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1128 + lVar24 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1118 + lVar24 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1108 + lVar24 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar32;
                  *(float *)(ray + k * 4 + 0x100) = fVar62;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar31 + 0xa0 + lVar24 * 4)
                  ;
                  *(uint *)(ray + k * 4 + 0x120) = uVar8;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  unaff_R13 = local_12b0;
                  goto LAB_0026ced6;
                }
                local_fd8 = *(undefined4 *)(local_1158 + lVar24 * 4);
                local_fc8 = local_1138[lVar24 + -4];
                uVar32 = *(undefined4 *)(local_1128 + lVar24 * 4);
                uVar5 = *(undefined4 *)(local_1118 + lVar24 * 4);
                local_fa8._4_4_ = uVar8;
                local_fa8._0_4_ = uVar8;
                local_fa8._8_4_ = uVar8;
                local_fa8._12_4_ = uVar8;
                uVar9 = *(undefined4 *)(lVar31 + 0xa0 + lVar24 * 4);
                local_fb8._4_4_ = uVar9;
                local_fb8._0_4_ = uVar9;
                local_fb8._8_4_ = uVar9;
                local_fb8._12_4_ = uVar9;
                local_ff8._4_4_ = uVar5;
                local_ff8._0_4_ = uVar5;
                local_ff8._8_4_ = uVar5;
                local_ff8._12_4_ = uVar5;
                uVar5 = *(undefined4 *)(local_1108 + lVar24 * 4);
                local_fe8._4_4_ = uVar5;
                local_fe8._0_4_ = uVar5;
                local_fe8._8_4_ = uVar5;
                local_fe8._12_4_ = uVar5;
                local_1008[0] = (RTCHitN)(char)uVar32;
                local_1008[1] = (RTCHitN)(char)((uint)uVar32 >> 8);
                local_1008[2] = (RTCHitN)(char)((uint)uVar32 >> 0x10);
                local_1008[3] = (RTCHitN)(char)((uint)uVar32 >> 0x18);
                local_1008[4] = (RTCHitN)(char)uVar32;
                local_1008[5] = (RTCHitN)(char)((uint)uVar32 >> 8);
                local_1008[6] = (RTCHitN)(char)((uint)uVar32 >> 0x10);
                local_1008[7] = (RTCHitN)(char)((uint)uVar32 >> 0x18);
                local_1008[8] = (RTCHitN)(char)uVar32;
                local_1008[9] = (RTCHitN)(char)((uint)uVar32 >> 8);
                local_1008[10] = (RTCHitN)(char)((uint)uVar32 >> 0x10);
                local_1008[0xb] = (RTCHitN)(char)((uint)uVar32 >> 0x18);
                local_1008[0xc] = (RTCHitN)(char)uVar32;
                local_1008[0xd] = (RTCHitN)(char)((uint)uVar32 >> 8);
                local_1008[0xe] = (RTCHitN)(char)((uint)uVar32 >> 0x10);
                local_1008[0xf] = (RTCHitN)(char)((uint)uVar32 >> 0x18);
                uStack_fd4 = local_fd8;
                uStack_fd0 = local_fd8;
                uStack_fcc = local_fd8;
                fStack_fc4 = local_fc8;
                fStack_fc0 = local_fc8;
                fStack_fbc = local_fc8;
                local_f98 = context->user->instID[0];
                uStack_f94 = local_f98;
                uStack_f90 = local_f98;
                uStack_f8c = local_f98;
                local_f88 = context->user->instPrimID[0];
                uStack_f84 = local_f88;
                uStack_f80 = local_f88;
                uStack_f7c = local_f88;
                uVar32 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(float *)(ray + k * 4 + 0x80) = local_1138[lVar24];
                local_1228 = *local_1218;
                uStack_1220 = local_1218[1];
                args.valid = (int *)&local_1228;
                args.geometryUserPtr = pGVar12->userPtr;
                args.context = context->user;
                args.hit = local_1008;
                args.N = 4;
                pRVar22 = (RTCRayN *)pGVar12->intersectionFilterN;
                args.ray = (RTCRayN *)ray;
                if (pRVar22 != (RTCRayN *)0x0) {
                  pRVar22 = (RTCRayN *)(*(code *)pRVar22)(&args);
                  uVar25 = local_12b8;
                  uVar26 = local_12c0;
                  uVar27 = local_12c8;
                }
                auVar17._8_8_ = uStack_1220;
                auVar17._0_8_ = local_1228;
                if (auVar17 == (undefined1  [16])0x0) {
                  auVar67._8_4_ = 0xffffffff;
                  auVar67._0_8_ = 0xffffffffffffffff;
                  auVar67._12_4_ = 0xffffffff;
                  auVar67 = auVar67 ^ _DAT_01febe20;
                }
                else {
                  pRVar22 = (RTCRayN *)context->args->filter;
                  if ((pRVar22 != (RTCRayN *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    pRVar22 = (RTCRayN *)(*(code *)pRVar22)(&args);
                    uVar25 = local_12b8;
                    uVar26 = local_12c0;
                    uVar27 = local_12c8;
                  }
                  auVar18._8_8_ = uStack_1220;
                  auVar18._0_8_ = local_1228;
                  auVar55._0_4_ = -(uint)((int)local_1228 == 0);
                  auVar55._4_4_ = -(uint)((int)((ulong)local_1228 >> 0x20) == 0);
                  auVar55._8_4_ = -(uint)((int)uStack_1220 == 0);
                  auVar55._12_4_ = -(uint)((int)((ulong)uStack_1220 >> 0x20) == 0);
                  auVar67 = auVar55 ^ _DAT_01febe20;
                  if (auVar18 != (undefined1  [16])0x0) {
                    auVar47 = blendvps(*(undefined1 (*) [16])args.hit,
                                       *(undefined1 (*) [16])(args.ray + 0xc0),auVar55);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar47;
                    auVar47 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                       *(undefined1 (*) [16])(args.ray + 0xd0),auVar55);
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar47;
                    auVar47 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                       *(undefined1 (*) [16])(args.ray + 0xe0),auVar55);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar47;
                    auVar47 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                       *(undefined1 (*) [16])(args.ray + 0xf0),auVar55);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar47;
                    auVar47 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                       *(undefined1 (*) [16])(args.ray + 0x100),auVar55);
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar47;
                    auVar47 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                       *(undefined1 (*) [16])(args.ray + 0x110),auVar55);
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar47;
                    auVar47 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                       *(undefined1 (*) [16])(args.ray + 0x120),auVar55);
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar47;
                    auVar47 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                       *(undefined1 (*) [16])(args.ray + 0x130),auVar55);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar47;
                    auVar47 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                       *(undefined1 (*) [16])(args.ray + 0x140),auVar55);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar47;
                    pRVar22 = args.ray;
                  }
                }
                if ((_DAT_01fecb20 & auVar67) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar32;
                }
                valid.field_0.v[lVar24] = 0.0;
                fVar62 = *(float *)(ray + k * 4 + 0x80);
                valid.field_0.i[1] = -(uint)(fStack_1294 <= fVar62) & valid.field_0.i[1];
                valid.field_0.i[0] = -(uint)(local_1298 <= fVar62) & valid.field_0.i[0];
                valid.field_0.i[2] = -(uint)(fStack_1290 <= fVar62) & valid.field_0.i[2];
                valid.field_0.i[3] = -(uint)(fStack_128c <= fVar62) & valid.field_0.i[3];
              }
              iVar21 = movmskps((int)pRVar22,(undefined1  [16])valid.field_0);
              unaff_R13 = local_12b0;
              if (iVar21 == 0) goto LAB_0026ced6;
              auVar14._4_4_ = fStack_1294;
              auVar14._0_4_ = local_1298;
              auVar14._8_4_ = fStack_1290;
              auVar14._12_4_ = fStack_128c;
              auVar37 = blendvps(_DAT_01feb9f0,auVar14,(undefined1  [16])valid.field_0);
              auVar89._4_4_ = auVar37._0_4_;
              auVar89._0_4_ = auVar37._4_4_;
              auVar89._8_4_ = auVar37._12_4_;
              auVar89._12_4_ = auVar37._8_4_;
              auVar47 = minps(auVar89,auVar37);
              auVar68._0_8_ = auVar47._8_8_;
              auVar68._8_4_ = auVar47._0_4_;
              auVar68._12_4_ = auVar47._4_4_;
              auVar47 = minps(auVar68,auVar47);
              auVar69._0_8_ =
                   CONCAT44(-(uint)(auVar47._4_4_ == auVar37._4_4_) & valid.field_0._4_4_,
                            -(uint)(auVar47._0_4_ == auVar37._0_4_) & valid.field_0._0_4_);
              auVar69._8_4_ = -(uint)(auVar47._8_4_ == auVar37._8_4_) & valid.field_0._8_4_;
              auVar69._12_4_ = -(uint)(auVar47._12_4_ == auVar37._12_4_) & valid.field_0._12_4_;
              iVar21 = movmskps(iVar21,auVar69);
              aVar56 = valid.field_0;
              if (iVar21 != 0) {
                aVar56.i[2] = auVar69._8_4_;
                aVar56._0_8_ = auVar69._0_8_;
                aVar56.i[3] = auVar69._12_4_;
              }
              uVar32 = movmskps(iVar21,(undefined1  [16])aVar56);
              uVar28 = CONCAT44((int)((ulong)pRVar22 >> 0x20),uVar32);
              lVar24 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                }
              }
              goto LAB_0026ca11;
            }
          }
        }
LAB_0026ced6:
        lVar29 = lVar29 + 1;
      } while (lVar29 != uVar23 - 8);
    }
    uVar32 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar47._4_4_ = uVar32;
    auVar47._0_4_ = uVar32;
    auVar47._8_4_ = uVar32;
    auVar47._12_4_ = uVar32;
    uVar23 = local_1210;
    fVar62 = local_1098;
    fVar92 = fStack_1094;
    fVar114 = fStack_1090;
    fVar115 = fStack_108c;
    fVar130 = local_10c8;
    fVar35 = fStack_10c4;
    fVar36 = fStack_10c0;
    fVar57 = fStack_10bc;
    fVar58 = local_10d8;
    fVar59 = fStack_10d4;
    fVar60 = fStack_10d0;
    fVar61 = fStack_10cc;
    fVar63 = local_10e8;
    fVar70 = fStack_10e4;
    fVar71 = fStack_10e0;
    fVar72 = fStack_10dc;
    fVar73 = local_10f8;
    fVar78 = fStack_10f4;
    fVar79 = fStack_10f0;
    fVar80 = fStack_10ec;
    fVar81 = local_1088;
    fVar90 = fStack_1084;
    fVar91 = fStack_1080;
    fVar95 = fStack_107c;
    fVar102 = local_10a8;
    fVar103 = fStack_10a4;
    fVar104 = fStack_10a0;
    fVar109 = fStack_109c;
    fVar112 = local_10b8;
    fVar113 = fStack_10b4;
    fVar116 = fStack_10b0;
    fVar118 = fStack_10ac;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }